

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

void __thiscall
BMRS<RemSP>::FindRunsMem
          (BMRS<RemSP> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t *flag_bits;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  pointer puVar6;
  pointer piVar7;
  unsigned_short uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint64_t uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  Run *pRVar16;
  ulong *puVar17;
  Run *pRVar18;
  unsigned_short uVar19;
  short sVar20;
  ulong uVar21;
  uint uVar22;
  Run *pRVar23;
  long lVar24;
  ulong uVar25;
  
  piVar7 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)data_width;
  uVar21 = *bits_start;
  sVar20 = 0;
  puVar17 = bits_start;
  pRVar23 = runs;
  while( true ) {
    for (; uVar21 != 0; uVar21 = (~uVar21 >> ((byte)lVar11 & 0x3f)) << ((byte)lVar11 & 0x3f)) {
      lVar11 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      pRVar23->start_pos = (short)lVar11 + sVar20;
      uVar21 = (~uVar21 >> ((byte)lVar11 & 0x3f)) << ((byte)lVar11 & 0x3f);
      if (uVar21 == 0) {
        do {
          sVar20 = sVar20 + 0x40;
          puVar1 = puVar17 + 1;
          puVar17 = puVar17 + 1;
        } while (*puVar1 == 0xffffffffffffffff);
        uVar21 = ~*puVar1;
      }
      lVar11 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      pRVar23->end_pos = (short)lVar11 + sVar20;
      uVar10 = RemSP::length_;
      lVar14 = (long)(int)RemSP::length_;
      piVar7[lVar14] = piVar7[lVar14] + 1;
      puVar6[lVar14] = uVar10;
      uVar10 = RemSP::length_ + 1;
      pRVar23->label = RemSP::length_;
      RemSP::length_ = uVar10;
      pRVar23 = pRVar23 + 1;
    }
    puVar17 = puVar17 + 1;
    if (puVar17 == bits_start + lVar13) break;
    sVar20 = sVar20 + 0x40;
    uVar21 = *puVar17;
  }
  pRVar23->start_pos = 0xffff;
  pRVar23->end_pos = 0xffff;
  if (height < 2) {
LAB_0023ed96:
    uVar10 = RemSP::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
    return;
  }
  uVar21 = 1;
LAB_0023ea6b:
  pRVar16 = pRVar23 + 1;
  flag_bits = bits_flag + (uVar21 - 1) * lVar13;
  puVar17 = bits_start + uVar21 * lVar13;
  puVar1 = puVar17 + lVar13;
  uVar25 = *puVar17;
  lVar11 = 0;
  pRVar23 = pRVar16;
  do {
    for (; uVar25 != 0; uVar25 = ~uVar25 & -1L << ((byte)lVar5 & 0x3f)) {
      lVar14 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar25 = (~uVar25 >> ((byte)lVar14 & 0x3f)) << ((byte)lVar14 & 0x3f);
      lVar24 = lVar11;
      if (uVar25 == 0) {
        do {
          lVar24 = lVar24 + 0x40;
          puVar2 = puVar17 + 1;
          puVar17 = puVar17 + 1;
        } while (*puVar2 == 0xffffffffffffffff);
        uVar25 = ~*puVar2;
      }
      lVar5 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      uVar10 = (uint)(lVar11 + lVar14);
      uVar9 = uVar10 & 0xffff;
      pRVar18 = runs;
      do {
        runs = pRVar18;
        uVar3 = runs->end_pos;
        pRVar18 = runs + 1;
      } while (uVar3 < uVar9);
      uVar4 = runs->start_pos;
      uVar19 = (unsigned_short)(lVar5 + lVar24);
      uVar22 = (uint)(lVar5 + lVar24) & 0xffff;
      uVar8 = (unsigned_short)(lVar11 + lVar14);
      if (uVar22 < uVar4) {
        pRVar23->start_pos = uVar8;
        pRVar23->end_pos = uVar19;
        uVar10 = RemSP::length_;
        lVar11 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = uVar10;
        uVar10 = RemSP::length_ + 1;
        pRVar23->label = RemSP::length_;
        RemSP::length_ = uVar10;
      }
      else {
        uVar15 = (uint)uVar4;
        if (uVar4 <= uVar9) {
          uVar15 = uVar10;
        }
        if (uVar3 < uVar22) {
          uVar12 = is_connected(this,flag_bits,uVar15 & 0xffff,(uint)uVar3);
          if (uVar12 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = runs->label;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar10] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar10] + 1;
            uVar10 = RemSP::mem_P_.vec_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar10];
          }
          uVar3 = pRVar18->start_pos;
          runs = pRVar18;
          while (uVar9 = uVar10, uVar3 <= uVar22) {
            if (uVar22 <= runs->end_pos) {
              uVar12 = is_connected(this,flag_bits,(uint)uVar3,uVar22);
              if (uVar12 != 0) {
                uVar22 = runs->label;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar22] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar22] + 1;
                uVar22 = RemSP::mem_P_.vec_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar22];
                if ((uVar10 != uVar22) && (uVar9 = uVar22, uVar10 != 0)) {
                  uVar9 = RemSP::MemMerge(uVar10,uVar22);
                }
              }
              break;
            }
            uVar12 = is_connected(this,flag_bits,(uint)uVar3,(uint)runs->end_pos);
            if (uVar12 != 0) {
              uVar15 = runs->label;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar15] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar15] + 1;
              uVar15 = RemSP::mem_P_.vec_.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar15];
              if ((uVar10 != uVar15) && (uVar9 = uVar15, uVar10 != 0)) {
                uVar9 = RemSP::MemMerge(uVar10,uVar15);
              }
            }
            pRVar18 = runs + 1;
            runs = runs + 1;
            uVar10 = uVar9;
            uVar3 = pRVar18->start_pos;
          }
          uVar10 = RemSP::length_;
          if (uVar9 == 0) {
            lVar11 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11] = uVar10;
            uVar9 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
          }
          pRVar23->label = uVar9;
        }
        else {
          uVar12 = is_connected(this,flag_bits,uVar15 & 0xffff,uVar22);
          uVar10 = RemSP::length_;
          if (uVar12 == 0) {
            lVar11 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11] = uVar10;
            uVar10 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
          }
          else {
            uVar10 = runs->label;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar10] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar10] + 1;
            uVar10 = RemSP::mem_P_.vec_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar10];
          }
          pRVar23->label = uVar10;
        }
        pRVar23->start_pos = uVar8;
        pRVar23->end_pos = uVar19;
      }
      pRVar23 = pRVar23 + 1;
      lVar11 = lVar24;
    }
    puVar17 = puVar17 + 1;
    if (puVar17 == puVar1) break;
    uVar25 = *puVar17;
    lVar11 = lVar11 + 0x40;
  } while( true );
  pRVar23->start_pos = 0xffff;
  pRVar23->end_pos = 0xffff;
  uVar21 = uVar21 + 1;
  runs = pRVar16;
  if (uVar21 == (uint)height) goto LAB_0023ed96;
  goto LAB_0023ea6b;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::MemGetLabel(runs_up->label);
                    else runs->label = LabelsSolver::MemNewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::MemGetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::MemNewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }